

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O1

void __thiscall
TCMallocImplementation::GetFreeListSizes
          (TCMallocImplementation *this,
          vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_> *v)

{
  iterator iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  Elf64_Ehdr *pEVar6;
  CentralFreeList *this_00;
  long lVar7;
  int64_t *piVar8;
  bool bVar9;
  uint64_t local_c88;
  uint64_t class_count [128];
  SmallSpanStats small;
  LargeSpanStats large;
  FreeListInfo span_info;
  FreeListInfo i_2;
  
  if (*(long *)(v + 8) != *(long *)v) {
    *(long *)(v + 8) = *(long *)v;
  }
  if ((DAT_00125c10 & 0xfffffffe) != 0) {
    this_00 = (CentralFreeList *)&DAT_00126100;
    lVar3 = 0;
    lVar5 = 0x2a0;
    do {
      lVar7 = (long)*(int *)(&tcmalloc::Static::sizemap_ + lVar5 * 4);
      class_count[0x7f] = lVar3 + 1;
      small.normal_length[0] = lVar7;
      iVar2 = tcmalloc::CentralFreeList::length(this_00);
      small.normal_length[1] = iVar2 * lVar7;
      small.normal_length[2] = (int64_t)GetFreeListSizes::kCentralCacheType;
      iVar1._M_current = *(FreeListInfo **)(v + 8);
      if (iVar1._M_current == *(FreeListInfo **)(v + 0x10)) {
        std::vector<MallocExtension::FreeListInfo,std::allocator<MallocExtension::FreeListInfo>>::
        _M_realloc_insert<MallocExtension::FreeListInfo_const&>
                  ((vector<MallocExtension::FreeListInfo,std::allocator<MallocExtension::FreeListInfo>>
                    *)v,iVar1,(FreeListInfo *)(class_count + 0x7f));
      }
      else {
        (iVar1._M_current)->total_bytes_free = small.normal_length[1];
        (iVar1._M_current)->type = "tcmalloc.central";
        (iVar1._M_current)->min_object_size = class_count[0x7f];
        (iVar1._M_current)->max_object_size = small.normal_length[0];
        *(long *)(v + 8) = *(long *)(v + 8) + 0x20;
      }
      iVar2 = tcmalloc::CentralFreeList::tc_length(this_00);
      small.normal_length[1] = iVar2 * lVar7;
      small.normal_length[2] = (int64_t)GetFreeListSizes::kTransferCacheType;
      iVar1._M_current = *(FreeListInfo **)(v + 8);
      if (iVar1._M_current == *(FreeListInfo **)(v + 0x10)) {
        std::vector<MallocExtension::FreeListInfo,std::allocator<MallocExtension::FreeListInfo>>::
        _M_realloc_insert<MallocExtension::FreeListInfo_const&>
                  ((vector<MallocExtension::FreeListInfo,std::allocator<MallocExtension::FreeListInfo>>
                    *)v,iVar1,(FreeListInfo *)(class_count + 0x7f));
      }
      else {
        (iVar1._M_current)->total_bytes_free = small.normal_length[1];
        (iVar1._M_current)->type = "tcmalloc.transfer";
        (iVar1._M_current)->min_object_size = class_count[0x7f];
        (iVar1._M_current)->max_object_size = small.normal_length[0];
        *(long *)(v + 8) = *(long *)(v + 8) + 0x20;
      }
      lVar3 = (long)*(int *)(&tcmalloc::Static::sizemap_ + lVar5 * 4);
      this_00 = this_00 + 1;
      uVar4 = lVar5 - 0x29e;
      lVar5 = lVar5 + 1;
    } while (uVar4 < DAT_00125c10);
  }
  memset(&local_c88,0,0x400);
  class_count[0x7f] = 0x14bcc0;
  LOCK();
  bVar9 = tcmalloc::Static::pageheap_._8_4_ == 0;
  if (bVar9) {
    tcmalloc::Static::pageheap_._8_4_ = 1;
  }
  UNLOCK();
  if (!bVar9) {
    SpinLock::SlowLock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
  }
  large.returned_pages = 0;
  tcmalloc::ThreadCache::GetThreadStats((uint64_t *)&large.returned_pages,&local_c88);
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)(class_count + 0x7f));
  if ((DAT_00125c10 & 0xfffffffe) != 0) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      class_count[0x7f] = lVar3 + 1U;
      small.normal_length[0] = (int64_t)(int)(&DAT_00125608)[lVar5];
      small.normal_length[1] = small.normal_length[0] * class_count[lVar5];
      small.normal_length[2] = (int64_t)GetFreeListSizes::kThreadCacheType;
      iVar1._M_current = *(FreeListInfo **)(v + 8);
      if (iVar1._M_current == *(FreeListInfo **)(v + 0x10)) {
        std::vector<MallocExtension::FreeListInfo,std::allocator<MallocExtension::FreeListInfo>>::
        _M_realloc_insert<MallocExtension::FreeListInfo_const&>
                  ((vector<MallocExtension::FreeListInfo,std::allocator<MallocExtension::FreeListInfo>>
                    *)v,iVar1,(FreeListInfo *)(class_count + 0x7f));
      }
      else {
        (iVar1._M_current)->total_bytes_free = small.normal_length[0] * class_count[lVar5];
        (iVar1._M_current)->type = "tcmalloc.thread";
        (iVar1._M_current)->min_object_size = lVar3 + 1U;
        (iVar1._M_current)->max_object_size = small.normal_length[0];
        *(long *)(v + 8) = *(long *)(v + 8) + 0x20;
      }
      lVar3 = (long)(int)(&DAT_00125608)[lVar5];
      uVar4 = lVar5 + 2;
      lVar5 = lVar5 + 1;
    } while (uVar4 < DAT_00125c10);
  }
  large.returned_pages = 0x14bcc0;
  LOCK();
  bVar9 = tcmalloc::Static::pageheap_._8_4_ == 0;
  if (bVar9) {
    tcmalloc::Static::pageheap_._8_4_ = 1;
  }
  UNLOCK();
  if (!bVar9) {
    SpinLock::SlowLock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
  }
  tcmalloc::PageHeap::GetSmallSpanStatsLocked
            ((PageHeap *)tcmalloc::Static::pageheap_,(SmallSpanStats *)(class_count + 0x7f));
  tcmalloc::PageHeap::GetLargeSpanStatsLocked
            ((PageHeap *)tcmalloc::Static::pageheap_,
             (LargeSpanStats *)(small.returned_length + 0x7f));
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&large.returned_pages);
  span_info.total_bytes_free = (size_t)GetFreeListSizes::kLargeSpanType;
  span_info.min_object_size = 0xffffffffffffffff;
  large.returned_pages = 0x100000;
  span_info.max_object_size = large.spans << 0xd;
  iVar1._M_current = *(FreeListInfo **)(v + 8);
  if (iVar1._M_current == *(FreeListInfo **)(v + 0x10)) {
    std::vector<MallocExtension::FreeListInfo,std::allocator<MallocExtension::FreeListInfo>>::
    _M_realloc_insert<MallocExtension::FreeListInfo_const&>
              ((vector<MallocExtension::FreeListInfo,std::allocator<MallocExtension::FreeListInfo>>
                *)v,iVar1,(FreeListInfo *)&large.returned_pages);
  }
  else {
    (iVar1._M_current)->total_bytes_free = span_info.max_object_size;
    (iVar1._M_current)->type = "tcmalloc.large";
    (iVar1._M_current)->min_object_size = 0x100000;
    (iVar1._M_current)->max_object_size = 0xffffffffffffffff;
    *(long *)(v + 8) = *(long *)(v + 8) + 0x20;
  }
  span_info.total_bytes_free = (size_t)GetFreeListSizes::kLargeUnmappedSpanType;
  span_info.max_object_size = large.normal_pages << 0xd;
  iVar1._M_current = *(FreeListInfo **)(v + 8);
  if (iVar1._M_current == *(FreeListInfo **)(v + 0x10)) {
    std::vector<MallocExtension::FreeListInfo,std::allocator<MallocExtension::FreeListInfo>>::
    _M_realloc_insert<MallocExtension::FreeListInfo_const&>
              ((vector<MallocExtension::FreeListInfo,std::allocator<MallocExtension::FreeListInfo>>
                *)v,iVar1,(FreeListInfo *)&large.returned_pages);
  }
  else {
    (iVar1._M_current)->total_bytes_free = large.normal_pages << 0xd;
    (iVar1._M_current)->type = "tcmalloc.large_unmapped";
    (iVar1._M_current)->min_object_size = large.returned_pages;
    (iVar1._M_current)->max_object_size = span_info.min_object_size;
    *(long *)(v + 8) = *(long *)(v + 8) + 0x20;
  }
  piVar8 = small.normal_length + 0x7f;
  span_info.type = (char *)(Elf64_Ehdr *)0x0;
  do {
    pEVar6 = (Elf64_Ehdr *)((long)span_info.type + 0x2000);
    iVar1._M_current = *(FreeListInfo **)(v + 8);
    if (iVar1._M_current == *(FreeListInfo **)(v + 0x10)) {
      std::vector<MallocExtension::FreeListInfo,std::allocator<MallocExtension::FreeListInfo>>::
      _M_realloc_insert<MallocExtension::FreeListInfo_const&>
                ((vector<MallocExtension::FreeListInfo,std::allocator<MallocExtension::FreeListInfo>>
                  *)v,iVar1,(FreeListInfo *)&span_info.type);
    }
    else {
      (iVar1._M_current)->total_bytes_free = piVar8[-0x80] * (long)pEVar6;
      (iVar1._M_current)->type = "tcmalloc.page";
      (iVar1._M_current)->min_object_size = (size_t)span_info.type;
      (iVar1._M_current)->max_object_size = (size_t)pEVar6;
      *(long *)(v + 8) = *(long *)(v + 8) + 0x20;
    }
    iVar1._M_current = *(FreeListInfo **)(v + 8);
    if (iVar1._M_current == *(FreeListInfo **)(v + 0x10)) {
      std::vector<MallocExtension::FreeListInfo,std::allocator<MallocExtension::FreeListInfo>>::
      _M_realloc_insert<MallocExtension::FreeListInfo_const&>
                ((vector<MallocExtension::FreeListInfo,std::allocator<MallocExtension::FreeListInfo>>
                  *)v,iVar1,(FreeListInfo *)&span_info.type);
    }
    else {
      (iVar1._M_current)->total_bytes_free = *piVar8 * (long)pEVar6;
      (iVar1._M_current)->type = "tcmalloc.page_unmapped";
      (iVar1._M_current)->min_object_size = (size_t)span_info.type;
      (iVar1._M_current)->max_object_size = (size_t)pEVar6;
      *(long *)(v + 8) = *(long *)(v + 8) + 0x20;
    }
    piVar8 = piVar8 + 1;
    span_info.type = (char *)pEVar6;
  } while (pEVar6 != &Elf64_Ehdr_00100000);
  return;
}

Assistant:

virtual void GetFreeListSizes(std::vector<MallocExtension::FreeListInfo>* v) {
    static const char kCentralCacheType[] = "tcmalloc.central";
    static const char kTransferCacheType[] = "tcmalloc.transfer";
    static const char kThreadCacheType[] = "tcmalloc.thread";
    static const char kPageHeapType[] = "tcmalloc.page";
    static const char kPageHeapUnmappedType[] = "tcmalloc.page_unmapped";
    static const char kLargeSpanType[] = "tcmalloc.large";
    static const char kLargeUnmappedSpanType[] = "tcmalloc.large_unmapped";

    v->clear();

    // central class information
    int64_t prev_class_size = 0;
    for (int cl = 1; cl < Static::num_size_classes(); ++cl) {
      size_t class_size = Static::sizemap()->ByteSizeForClass(cl);
      MallocExtension::FreeListInfo i;
      i.min_object_size = prev_class_size + 1;
      i.max_object_size = class_size;
      i.total_bytes_free =
          Static::central_cache()[cl].length() * class_size;
      i.type = kCentralCacheType;
      v->push_back(i);

      // transfer cache
      i.total_bytes_free =
          Static::central_cache()[cl].tc_length() * class_size;
      i.type = kTransferCacheType;
      v->push_back(i);

      prev_class_size = Static::sizemap()->ByteSizeForClass(cl);
    }

    // Add stats from per-thread heaps
    uint64_t class_count[kClassSizesMax];
    memset(class_count, 0, sizeof(class_count));
    {
      SpinLockHolder h(Static::pageheap_lock());
      uint64_t thread_bytes = 0;
      ThreadCache::GetThreadStats(&thread_bytes, class_count);
    }

    prev_class_size = 0;
    for (int cl = 1; cl < Static::num_size_classes(); ++cl) {
      MallocExtension::FreeListInfo i;
      i.min_object_size = prev_class_size + 1;
      i.max_object_size = Static::sizemap()->ByteSizeForClass(cl);
      i.total_bytes_free =
          class_count[cl] * Static::sizemap()->ByteSizeForClass(cl);
      i.type = kThreadCacheType;
      v->push_back(i);

      prev_class_size = Static::sizemap()->ByteSizeForClass(cl);
    }

    // append page heap info
    PageHeap::SmallSpanStats small;
    PageHeap::LargeSpanStats large;
    {
      SpinLockHolder h(Static::pageheap_lock());
      Static::pageheap()->GetSmallSpanStatsLocked(&small);
      Static::pageheap()->GetLargeSpanStatsLocked(&large);
    }

    // large spans: mapped
    MallocExtension::FreeListInfo span_info;
    span_info.type = kLargeSpanType;
    span_info.max_object_size = (std::numeric_limits<size_t>::max)();
    span_info.min_object_size = kMaxPages << kPageShift;
    span_info.total_bytes_free = large.normal_pages << kPageShift;
    v->push_back(span_info);

    // large spans: unmapped
    span_info.type = kLargeUnmappedSpanType;
    span_info.total_bytes_free = large.returned_pages << kPageShift;
    v->push_back(span_info);

    // small spans
    for (int s = 1; s <= kMaxPages; s++) {
      MallocExtension::FreeListInfo i;
      i.max_object_size = (s << kPageShift);
      i.min_object_size = ((s - 1) << kPageShift);

      i.type = kPageHeapType;
      i.total_bytes_free = (s << kPageShift) * small.normal_length[s - 1];
      v->push_back(i);

      i.type = kPageHeapUnmappedType;
      i.total_bytes_free = (s << kPageShift) * small.returned_length[s - 1];
      v->push_back(i);
    }
  }